

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int disposition_set_state(DISPOSITION_HANDLE disposition,AMQP_VALUE state_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    iVar2 = 0x22fb;
  }
  else {
    iVar2 = 0x230b;
    if (state_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(state_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(disposition->composite_value,4,item_value);
        iVar2 = 0x2311;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int disposition_set_state(DISPOSITION_HANDLE disposition, AMQP_VALUE state_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        AMQP_VALUE state_amqp_value;
        if (state_value == NULL)
        {
            state_amqp_value = NULL;
        }
        else
        {
            state_amqp_value = amqpvalue_clone(state_value);
        }
        if (state_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(disposition_instance->composite_value, 4, state_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(state_amqp_value);
        }
    }

    return result;
}